

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::CalcTiltedLighting
          (DrawTiltedSpanPalCommand *this,double lval,double lend,int width,DrawerThread *thread)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *in_RCX;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar2 = (ulong)(uint)width;
  uVar6 = 0x1f;
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    uVar5 = this->planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    if ((int)uVar5 < 0x1f) {
      uVar6 = uVar5;
    }
    uVar5 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = uVar5;
    }
    in_RCX = this->basecolormapdata + (uVar6 << 8);
  }
  else {
    dVar8 = (lend - lval) / (double)width;
    uVar7 = (ulong)width;
    if (24.0 <= lval) {
      dVar9 = 24.0;
      if (lval <= 24.0) {
        dVar9 = lval;
      }
      uVar5 = this->planeshade - SUB84(dVar9 + 103079215104.0,0) >> 0x10;
      if (0x1e < (int)uVar5) {
        uVar5 = uVar6;
      }
      uVar3 = 0;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      in_RCX = this->basecolormapdata + (uVar5 << 8);
      for (; ((long)uVar3 <= (long)uVar7 && (24.0 <= lval)); lval = lval + dVar8) {
        thread->tiltlighting[uVar3] = in_RCX;
        uVar3 = uVar3 + 1;
      }
    }
    else {
      uVar3 = 0;
    }
    uVar5 = (uint)uVar3;
    if (24.0 <= lend) {
      dVar9 = 24.0;
      if (lend <= 24.0) {
        dVar9 = lend;
      }
      uVar4 = this->planeshade - SUB84(dVar9 + 103079215104.0,0) >> 0x10;
      if ((int)uVar4 < 0x1f) {
        uVar6 = uVar4;
      }
      uVar4 = 0;
      if (0 < (int)uVar6) {
        uVar4 = uVar6;
      }
      in_RCX = this->basecolormapdata + (uVar4 << 8);
      for (; ((long)(int)uVar5 < (long)uVar7 && (24.0 <= lend)); lend = lend - dVar8) {
        thread->tiltlighting[uVar7] = in_RCX;
        uVar7 = uVar7 - 1;
      }
      uVar2 = uVar7 & 0xffffffff;
    }
    width = (int)uVar2;
    if (0 < width) {
      dVar9 = (double)this->planeshade * 1.52587890625e-05 - lval;
      dVar8 = (lval - lend) / (double)width;
      if (0.0 <= dVar8) {
        if (dVar9 < 31.0) {
          for (uVar3 = uVar3 & 0xffffffff; (dVar9 < 0.0 && (uVar3 <= uVar2)); uVar3 = uVar3 + 1) {
            thread->tiltlighting[uVar3] = this->basecolormapdata;
            dVar9 = dVar9 + dVar8;
          }
          if (width < (int)uVar3) {
            return;
          }
          for (; (uVar3 <= uVar2 && (dVar9 < 31.0)); dVar9 = dVar9 + dVar8) {
            thread->tiltlighting[uVar3] =
                 this->basecolormapdata + (SUB84(dVar9 + 6755399441055744.0,0) << 8);
            uVar3 = uVar3 + 1;
          }
        }
        uVar5 = (uint)uVar3;
        in_RCX = this->basecolormapdata + 0x1f00;
      }
      else {
        if (1.0 <= dVar9) {
          if (32.0 <= dVar9) {
            puVar1 = this->basecolormapdata;
            for (uVar3 = uVar3 & 0xffffffff; (32.0 <= dVar9 && (uVar3 <= uVar2)); uVar3 = uVar3 + 1)
            {
              thread->tiltlighting[uVar3] = puVar1 + 0x1f00;
              dVar9 = dVar9 + dVar8;
            }
            if (width < (int)uVar3) {
              return;
            }
          }
          uVar3 = uVar3 & 0xffffffff;
          for (; (uVar3 <= uVar2 && (0.0 <= dVar9)); dVar9 = dVar9 + dVar8) {
            thread->tiltlighting[uVar3] =
                 this->basecolormapdata + (SUB84(dVar9 + 6755399441055744.0,0) << 8);
            uVar3 = uVar3 + 1;
          }
        }
        uVar5 = (uint)uVar3;
        in_RCX = this->basecolormapdata;
      }
    }
  }
  for (uVar2 = (ulong)uVar5; (long)uVar2 <= (long)width; uVar2 = uVar2 + 1) {
    thread->tiltlighting[uVar2] = in_RCX;
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::CalcTiltedLighting(double lval, double lend, int width, DrawerThread *thread)
	{
		const uint8_t **tiltlighting = thread->tiltlighting;

		double lstep;
		uint8_t *lightfiller;
		int i = 0;

		if (width == 0 || lval == lend)
		{ // Constant lighting
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
		}
		else
		{
			lstep = (lend - lval) / width;
			if (lval >= MAXLIGHTVIS)
			{ // lval starts "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
				for (; i <= width && lval >= MAXLIGHTVIS; ++i)
				{
					tiltlighting[i] = lightfiller;
					lval += lstep;
				}
			}
			if (lend >= MAXLIGHTVIS)
			{ // lend ends "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
				for (; width > i && lend >= MAXLIGHTVIS; --width)
				{
					tiltlighting[width] = lightfiller;
					lend -= lstep;
				}
			}
			if (width > 0)
			{
				lval = FIXED2DBL(planeshade) - lval;
				lend = FIXED2DBL(planeshade) - lend;
				lstep = (lend - lval) / width;
				if (lstep < 0)
				{ // Going from dark to light
					if (lval < 1.)
					{ // All bright
						lightfiller = basecolormapdata;
					}
					else
					{
						if (lval >= NUMCOLORMAPS)
						{ // Starts beyond the dark end
							uint8_t *clight = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
							while (lval >= NUMCOLORMAPS && i <= width)
							{
								tiltlighting[i++] = clight;
								lval += lstep;
							}
							if (i > width)
								return;
						}
						while (i <= width && lval >= 0)
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata;
					}
				}
				else
				{ // Going from light to dark
					if (lval >= (NUMCOLORMAPS - 1))
					{ // All dark
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
					else
					{
						while (lval < 0 && i <= width)
						{
							tiltlighting[i++] = basecolormapdata;
							lval += lstep;
						}
						if (i > width)
							return;
						while (i <= width && lval < (NUMCOLORMAPS - 1))
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
				}
			}
		}
		for (; i <= width; i++)
		{
			tiltlighting[i] = lightfiller;
		}
	}